

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_client.cpp
# Opt level: O3

void __thiscall zmq::plain_client_t::produce_hello(plain_client_t *this,msg_t *msg_)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  undefined4 *puVar4;
  int *piVar5;
  char *errmsg_;
  string password;
  string username;
  long *local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long local_58 [2];
  long *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  long local_38 [2];
  
  pcVar1 = (this->super_mechanism_base_t).super_mechanism_t.options.plain_username._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,
             pcVar1 + (this->super_mechanism_base_t).super_mechanism_t.options.plain_username.
                      _M_string_length);
  if (0xff < CONCAT71(uStack_3f,local_40)) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","username.length () <= UCHAR_MAX",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
            ,0x79);
    fflush(_stderr);
    zmq_abort("username.length () <= UCHAR_MAX");
  }
  pcVar1 = (this->super_mechanism_base_t).super_mechanism_t.options.plain_password._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,
             pcVar1 + (this->super_mechanism_base_t).super_mechanism_t.options.plain_password.
                      _M_string_length);
  uVar3 = CONCAT71(uStack_5f,local_60);
  if (0xff < uVar3) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","password.length () <= UCHAR_MAX",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
            ,0x7c);
    fflush(_stderr);
    zmq_abort("password.length () <= UCHAR_MAX");
    uVar3 = CONCAT71(uStack_5f,local_60);
  }
  iVar2 = msg_t::init_size(msg_,CONCAT71(uStack_3f,local_40) + uVar3 + 8);
  if (iVar2 != 0) {
    piVar5 = __errno_location();
    errmsg_ = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
            ,0x83);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
  puVar4 = (undefined4 *)msg_t::data(msg_);
  *(undefined2 *)(puVar4 + 1) = 0x4f4c;
  *puVar4 = 0x4c454805;
  *(undefined1 *)((long)puVar4 + 6) = local_40;
  memcpy((void *)((long)puVar4 + 7),local_48,CONCAT71(uStack_3f,local_40));
  *(undefined1 *)((long)puVar4 + CONCAT71(uStack_3f,local_40) + 7) = local_60;
  memcpy((void *)((long)puVar4 + CONCAT71(uStack_3f,local_40) + 8),local_68,
         CONCAT71(uStack_5f,local_60));
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void zmq::plain_client_t::produce_hello (msg_t *msg_) const
{
    const std::string username = options.plain_username;
    zmq_assert (username.length () <= UCHAR_MAX);

    const std::string password = options.plain_password;
    zmq_assert (password.length () <= UCHAR_MAX);

    const size_t command_size = hello_prefix_len + brief_len_size
                                + username.length () + brief_len_size
                                + password.length ();

    const int rc = msg_->init_size (command_size);
    errno_assert (rc == 0);

    unsigned char *ptr = static_cast<unsigned char *> (msg_->data ());
    memcpy (ptr, hello_prefix, hello_prefix_len);
    ptr += hello_prefix_len;

    *ptr++ = static_cast<unsigned char> (username.length ());
    memcpy (ptr, username.c_str (), username.length ());
    ptr += username.length ();

    *ptr++ = static_cast<unsigned char> (password.length ());
    memcpy (ptr, password.c_str (), password.length ());
}